

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void lj_crecord_tonumber(jit_State *J,RecordFFData *rd)

{
  CTState *cts_00;
  TRef TVar1;
  CType *local_a0;
  CType *ct;
  CType *d;
  CTState *cts;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  cts_00 = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  local_a0 = lj_ctype_rawref(cts_00,(uint)*(ushort *)((rd->argv->u64 & 0x7fffffffffff) + 10));
  if (local_a0->info >> 0x1c == 5) {
    local_a0 = cts_00->tab + (local_a0->info & 0xffff);
  }
  if ((local_a0->info >> 0x1c == 0) || ((local_a0->info & 0xf4000000) == 0x34000000)) {
    if ((((local_a0->info & 0xf4000000) == 0) && (local_a0->size < 5)) &&
       ((local_a0->size != 4 || ((local_a0->info & 0x800000) == 0)))) {
      ct = cts_00->tab + 9;
    }
    else {
      ct = cts_00->tab + 0xe;
    }
    TVar1 = crec_ct_tv(J,ct,0,*J->base,rd->argv);
    *J->base = TVar1;
  }
  else {
    argv2cdata(J,*J->base,rd->argv);
    *J->base = 0x7fff;
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_crecord_tonumber(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CType *d, *ct = lj_ctype_rawref(cts, cdataV(&rd->argv[0])->ctypeid);
  if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
  if (ctype_isnum(ct->info) || ctype_iscomplex(ct->info)) {
    if (ctype_isinteger_or_bool(ct->info) && ct->size <= 4 &&
	!(ct->size == 4 && (ct->info & CTF_UNSIGNED)))
      d = ctype_get(cts, CTID_INT32);
    else
      d = ctype_get(cts, CTID_DOUBLE);
    J->base[0] = crec_ct_tv(J, d, 0, J->base[0], &rd->argv[0]);
  } else {
    /* Specialize to the ctype that couldn't be converted. */
    argv2cdata(J, J->base[0], &rd->argv[0]);
    J->base[0] = TREF_NIL;
  }
}